

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O2

double FIX::double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  int iVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  sbyte sVar11;
  int iVar12;
  byte bVar13;
  Double *this;
  DiyFp diy_fp;
  
  uVar6 = CONCAT71(in_register_00000011,sign);
  pcVar9 = *current;
  if (pcVar9 == end) {
    __assert_fail("*current != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x21d,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                 );
  }
  *result_is_junk = true;
  while (*pcVar9 == '0') {
    pcVar9 = pcVar9 + 1;
    *current = pcVar9;
    if (pcVar9 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  sVar11 = 0x18;
  if (read_as_double) {
    sVar11 = 0x35;
  }
  this = (Double *)0x0;
  iVar12 = 1;
  while( true ) {
    iVar5 = (int)*pcVar9;
    if ((0x37 < iVar5) || (9 < iVar5 - 0x30U)) {
      uVar10 = 0;
      if (!allow_trailing_junk) {
        uVar6 = uVar6 & 0xffffffff;
        bVar2 = AdvanceToNonspace<char*>(current,end);
        if (bVar2) {
          return junk_string_value;
        }
      }
      goto LAB_0017bba6;
    }
    this = (Double *)((long)iVar5 + (long)this * 8 + -0x30);
    uVar8 = (long)this >> sVar11;
    pcVar9 = pcVar9 + 1;
    if ((int)uVar8 != 0) break;
    *current = pcVar9;
    if (pcVar9 == end) {
      uVar10 = 0;
LAB_0017bba6:
      if (1L << sVar11 <= (long)this) {
        __assert_fail("number < ((int64_t)1 << kSignificandSize)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x273,
                      "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                     );
      }
      if (this != (Double *)(long)(double)(long)this) {
        __assert_fail("static_cast<int64_t>(static_cast<double>(number)) == number",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x274,
                      "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                     );
      }
      *result_is_junk = false;
      if (uVar10 != 0) {
        if (this == (Double *)0x0) {
          __assert_fail("number != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                        ,0x280,
                        "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                       );
        }
        diy_fp.f_ = (ulong)uVar10;
        diy_fp._8_8_ = uVar6;
        dVar4 = (double)Double::DiyFpToUint64(this,diy_fp);
        return dVar4;
      }
      if ((char)uVar6 != '\0') {
        if (this == (Double *)0x0) {
          return -0.0;
        }
        return (double)-(long)this;
      }
      return (double)(long)this;
    }
  }
  bVar7 = 0;
  for (; 1 < (int)(uint)uVar8; uVar8 = (ulong)((uint)uVar8 >> 1)) {
    iVar12 = iVar12 + 1;
    bVar7 = bVar7 + 1;
  }
  uVar8 = (long)this >> ((byte)iVar12 & 0x3f);
  uVar10 = (uint)this & ~(-1 << ((byte)iVar12 & 0x1f));
  iVar12 = -iVar12;
  bVar13 = 1;
  for (; *current = pcVar9, pcVar9 != end; pcVar9 = pcVar9 + 1) {
    cVar1 = *pcVar9;
    if ((0x37 < cVar1) || (9 < (int)cVar1 - 0x30U)) break;
    bVar13 = bVar13 & cVar1 == '0';
    iVar12 = iVar12 + -3;
  }
  if (!allow_trailing_junk) {
    bVar2 = AdvanceToNonspace<char*>(current,end);
    uVar6 = uVar6 & 0xffffffff;
    if (bVar2) {
      return junk_string_value;
    }
  }
  uVar3 = 1 << (bVar7 & 0x1f);
  if ((int)uVar3 < (int)uVar10) {
    uVar8 = uVar8 + 1;
  }
  else if (uVar10 == uVar3) {
    uVar8 = uVar8 + ((byte)(~bVar13 | (byte)uVar8) & 1);
  }
  bVar2 = (uVar8 >> sVar11 & 1) != 0;
  uVar10 = (uint)bVar2 - iVar12;
  this = (Double *)((long)uVar8 >> bVar2);
  goto LAB_0017bba6;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}